

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_sampler * llama_sampler_penalties_clone(llama_sampler *smpl)

{
  llama_sampler *plVar1;
  undefined8 in_RDI;
  float unaff_retaddr;
  int32_t unaff_retaddr_00;
  llama_sampler_penalties *result_ctx;
  llama_sampler *result;
  llama_sampler_penalties *ctx;
  ring_buffer<int> *in_stack_ffffffffffffffd8;
  
  plVar1 = llama_sampler_init_penalties
                     (unaff_retaddr_00,unaff_retaddr,(float)((ulong)in_RDI >> 0x20),(float)in_RDI);
  ring_buffer<int>::operator=((ring_buffer<int> *)plVar1->ctx,in_stack_ffffffffffffffd8);
  return plVar1;
}

Assistant:

static struct llama_sampler * llama_sampler_penalties_clone(const struct llama_sampler * smpl) {
    const auto * ctx = (const llama_sampler_penalties *) smpl->ctx;
    auto * result = llama_sampler_init_penalties(
            ctx->penalty_last_n,
            ctx->penalty_repeat,
            ctx->penalty_freq,
            ctx->penalty_present);

    // copy the state
    {
        auto * result_ctx = (llama_sampler_penalties *) result->ctx;

        result_ctx->prev = ctx->prev;
    }

    return result;
}